

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O2

void __thiscall serialize_tests::with_params_base::test_method(with_params_base *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  string *psVar2;
  Base *pBVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  ParamsWrapper<serialize_tests::BaseFormat,_serialize_tests::Base> local_c8;
  undefined1 *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  char *local_98;
  char *local_90;
  DataStream stream;
  Base b;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  b.m_base_data = '\x0f';
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  stream.m_read_pos = 0;
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.m_params = (BaseFormat *)&RAW;
  local_c8.m_object = &b;
  ParamsWrapper<serialize_tests::BaseFormat,_serialize_tests::Base>::Serialize<DataStream>
            (&local_c8,&stream);
  local_98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_90 = "";
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1b4;
  file.m_begin = (iterator)&local_98;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_a8,msg);
  local_c8.m_object = (Base *)((ulong)local_c8.m_object & 0xffffffffffffff00);
  local_c8.m_params = (BaseFormat *)&PTR__lazy_ostream_011480b0;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = "";
  local_d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_d0 = "";
  DataStream::str_abi_cxx11_(&local_58,&stream);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
            (&local_c8,&local_d8,0x1b4,1,2,psVar2,"stream.str()",anon_var_dwarf_10d72f5 + 1,
             "\"\\x0F\"");
  std::__cxx11::string::~string((string *)&local_58);
  b.m_base_data = '\0';
  local_c8.m_params = (BaseFormat *)&RAW;
  local_c8.m_object = &b;
  ParamsWrapper<serialize_tests::BaseFormat,_serialize_tests::Base>::Unserialize<DataStream>
            (&local_c8,&stream);
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1b8;
  file_00.m_begin = (iterator)&local_e8;
  msg_00.m_end = (iterator)psVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_f8,msg_00
            );
  local_c8.m_object = (Base *)((ulong)local_c8.m_object & 0xffffffffffffff00);
  local_c8.m_params = (BaseFormat *)&PTR__lazy_ostream_011480b0;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = "";
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_100 = "";
  local_58._M_dataplus._M_p._0_4_ = 0xf;
  pvVar1 = (iterator)0x2;
  pBVar3 = &b;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (&local_c8,&local_108,0x1b8,1,2,&b,"b.m_base_data",&local_58,"0x0F");
  if (stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  stream.m_read_pos = 0;
  local_c8.m_params = (BaseFormat *)&HEX;
  local_c8.m_object = &b;
  ParamsWrapper<serialize_tests::BaseFormat,_serialize_tests::Base>::Serialize<DataStream>
            (&local_c8,&stream);
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1bd;
  file_01.m_begin = (iterator)&local_118;
  msg_01.m_end = (iterator)pBVar3;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_128,
             msg_01);
  local_c8.m_object = (Base *)((ulong)local_c8.m_object & 0xffffffffffffff00);
  local_c8.m_params = (BaseFormat *)&PTR__lazy_ostream_011480b0;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = "";
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_130 = "";
  DataStream::str_abi_cxx11_(&local_58,&stream);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[3]>
            (&local_c8,&local_138,0x1bd,1,2,psVar2,"stream.str()","0f","\"0f\"");
  std::__cxx11::string::~string((string *)&local_58);
  b.m_base_data = '\0';
  local_c8.m_params = (BaseFormat *)&HEX;
  local_c8.m_object = &b;
  ParamsWrapper<serialize_tests::BaseFormat,_serialize_tests::Base>::Unserialize<DataStream>
            (&local_c8,&stream);
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x1c1;
  file_02.m_begin = (iterator)&local_148;
  msg_02.m_end = (iterator)psVar2;
  msg_02.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_158,
             msg_02);
  local_c8.m_object = (Base *)((ulong)local_c8.m_object & 0xffffffffffffff00);
  local_c8.m_params = (BaseFormat *)&PTR__lazy_ostream_011480b0;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = "";
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_160 = "";
  local_58._M_dataplus._M_p._0_4_ = 0xf;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (&local_c8,&local_168,0x1c1,1,2,&b,"b.m_base_data",&local_58,"0x0F");
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&stream);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(with_params_base)
{
    Base b{0x0F};

    DataStream stream;

    stream << RAW(b);
    BOOST_CHECK_EQUAL(stream.str(), "\x0F");

    b.m_base_data = 0;
    stream >> RAW(b);
    BOOST_CHECK_EQUAL(b.m_base_data, 0x0F);

    stream.clear();

    stream << HEX(b);
    BOOST_CHECK_EQUAL(stream.str(), "0f");

    b.m_base_data = 0;
    stream >> HEX(b);
    BOOST_CHECK_EQUAL(b.m_base_data, 0x0F);
}